

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O1

void __thiscall
NshHistoryGetEntry_FailureInvalidTooHighAge_Test::TestBody
          (NshHistoryGetEntry_FailureInvalidTooHighAge_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  nsh_status_t status;
  char entry [128];
  nsh_history_t hist;
  Message local_8c0;
  AssertHelper local_8b8;
  internal local_8b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8a8;
  nsh_status_t local_89c;
  char local_898 [132];
  nsh_history_t local_814;
  
  nsh_history_reset(&local_814);
  local_898[0x70] = '\0';
  local_898[0x71] = '\0';
  local_898[0x72] = '\0';
  local_898[0x73] = '\0';
  local_898[0x74] = '\0';
  local_898[0x75] = '\0';
  local_898[0x76] = '\0';
  local_898[0x77] = '\0';
  local_898[0x78] = '\0';
  local_898[0x79] = '\0';
  local_898[0x7a] = '\0';
  local_898[0x7b] = '\0';
  local_898[0x7c] = '\0';
  local_898[0x7d] = '\0';
  local_898[0x7e] = '\0';
  local_898[0x7f] = '\0';
  local_898[0x60] = '\0';
  local_898[0x61] = '\0';
  local_898[0x62] = '\0';
  local_898[99] = '\0';
  local_898[100] = '\0';
  local_898[0x65] = '\0';
  local_898[0x66] = '\0';
  local_898[0x67] = '\0';
  local_898[0x68] = '\0';
  local_898[0x69] = '\0';
  local_898[0x6a] = '\0';
  local_898[0x6b] = '\0';
  local_898[0x6c] = '\0';
  local_898[0x6d] = '\0';
  local_898[0x6e] = '\0';
  local_898[0x6f] = '\0';
  local_898[0x50] = '\0';
  local_898[0x51] = '\0';
  local_898[0x52] = '\0';
  local_898[0x53] = '\0';
  local_898[0x54] = '\0';
  local_898[0x55] = '\0';
  local_898[0x56] = '\0';
  local_898[0x57] = '\0';
  local_898[0x58] = '\0';
  local_898[0x59] = '\0';
  local_898[0x5a] = '\0';
  local_898[0x5b] = '\0';
  local_898[0x5c] = '\0';
  local_898[0x5d] = '\0';
  local_898[0x5e] = '\0';
  local_898[0x5f] = '\0';
  local_898[0x40] = '\0';
  local_898[0x41] = '\0';
  local_898[0x42] = '\0';
  local_898[0x43] = '\0';
  local_898[0x44] = '\0';
  local_898[0x45] = '\0';
  local_898[0x46] = '\0';
  local_898[0x47] = '\0';
  local_898[0x48] = '\0';
  local_898[0x49] = '\0';
  local_898[0x4a] = '\0';
  local_898[0x4b] = '\0';
  local_898[0x4c] = '\0';
  local_898[0x4d] = '\0';
  local_898[0x4e] = '\0';
  local_898[0x4f] = '\0';
  local_898[0x30] = '\0';
  local_898[0x31] = '\0';
  local_898[0x32] = '\0';
  local_898[0x33] = '\0';
  local_898[0x34] = '\0';
  local_898[0x35] = '\0';
  local_898[0x36] = '\0';
  local_898[0x37] = '\0';
  local_898[0x38] = '\0';
  local_898[0x39] = '\0';
  local_898[0x3a] = '\0';
  local_898[0x3b] = '\0';
  local_898[0x3c] = '\0';
  local_898[0x3d] = '\0';
  local_898[0x3e] = '\0';
  local_898[0x3f] = '\0';
  local_898[0x20] = '\0';
  local_898[0x21] = '\0';
  local_898[0x22] = '\0';
  local_898[0x23] = '\0';
  local_898[0x24] = '\0';
  local_898[0x25] = '\0';
  local_898[0x26] = '\0';
  local_898[0x27] = '\0';
  local_898[0x28] = '\0';
  local_898[0x29] = '\0';
  local_898[0x2a] = '\0';
  local_898[0x2b] = '\0';
  local_898[0x2c] = '\0';
  local_898[0x2d] = '\0';
  local_898[0x2e] = '\0';
  local_898[0x2f] = '\0';
  local_898[0x10] = '\0';
  local_898[0x11] = '\0';
  local_898[0x12] = '\0';
  local_898[0x13] = '\0';
  local_898[0x14] = '\0';
  local_898[0x15] = '\0';
  local_898[0x16] = '\0';
  local_898[0x17] = '\0';
  local_898[0x18] = '\0';
  local_898[0x19] = '\0';
  local_898[0x1a] = '\0';
  local_898[0x1b] = '\0';
  local_898[0x1c] = '\0';
  local_898[0x1d] = '\0';
  local_898[0x1e] = '\0';
  local_898[0x1f] = '\0';
  local_898[0] = '\0';
  local_898[1] = '\0';
  local_898[2] = '\0';
  local_898[3] = '\0';
  local_898[4] = '\0';
  local_898[5] = '\0';
  local_898[6] = '\0';
  local_898[7] = '\0';
  local_898[8] = '\0';
  local_898[9] = '\0';
  local_898[10] = '\0';
  local_898[0xb] = '\0';
  local_898[0xc] = '\0';
  local_898[0xd] = '\0';
  local_898[0xe] = '\0';
  local_898[0xf] = '\0';
  local_89c = nsh_history_get_entry(&local_814,1,local_898);
  local_8c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 5;
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            (local_8b0,"status","NSH_STATUS_WRONG_ARG",&local_89c,(nsh_status *)&local_8c0);
  if (local_8b0[0] == (internal)0x0) {
    testing::Message::Message(&local_8c0);
    if (local_8a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_8a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0xb5,message);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    if ((long *)CONCAT44(local_8c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_8c0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_8c0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_8c0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_8a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_8a8,local_8a8);
  }
  return;
}

Assistant:

TEST(NshHistoryGetEntry, FailureInvalidTooHighAge)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    char entry[NSH_LINE_BUFFER_SIZE] = {};
    auto status = nsh_history_get_entry(&hist, 1, entry);

    ASSERT_EQ(status, NSH_STATUS_WRONG_ARG);
}